

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

bool absl::lts_20250127::container_internal::operator==(iterator *a,iterator *b)

{
  slot_type *psVar1;
  slot_type *psVar2;
  char *pcVar3;
  slot_type *psVar4;
  slot_type *psVar5;
  undefined1 uVar6;
  slot_type *psVar7;
  bool bVar8;
  slot_type *psVar9;
  
  psVar7 = (slot_type *)a->ctrl_;
  if ((psVar7 == (slot_type *)(kEmptyGroup + 0x10) || psVar7 == (slot_type *)0x0) ||
     (kSentinel < *(ctrl_t *)psVar7)) {
    psVar1 = (slot_type *)b->ctrl_;
    if ((psVar1 != (slot_type *)(kEmptyGroup + 0x10) && psVar1 != (slot_type *)0x0) &&
       (*(ctrl_t *)psVar1 < ~kSentinel)) goto LAB_001743a5;
    if (psVar7 == (slot_type *)(kEmptyGroup + 0x10) && psVar1 == (slot_type *)(kEmptyGroup + 0x10))
    {
LAB_00174398:
      return psVar7 == psVar1;
    }
    if ((psVar7 == (slot_type *)(kEmptyGroup + 0x10)) !=
        (psVar1 == (slot_type *)(kEmptyGroup + 0x10))) goto LAB_001743aa;
    if (psVar7 == (slot_type *)0x0 || psVar1 == (slot_type *)0x0) goto LAB_00174398;
    if ((psVar1 == (slot_type *)kSooControl) == (psVar7 == (slot_type *)kSooControl)) {
      a = (iterator *)(a->field_1).slot_;
      psVar2 = (b->field_1).slot_;
      if (psVar7 == (slot_type *)kSooControl) {
        bVar8 = (slot_type *)a == psVar2;
      }
      else {
        psVar9 = psVar2;
        psVar4 = psVar1;
        psVar5 = (slot_type *)a;
        if (psVar1 < psVar7) {
          psVar9 = (slot_type *)a;
          psVar4 = psVar7;
          psVar5 = psVar2;
        }
        b = (iterator *)CONCAT71((int7)((ulong)psVar4 >> 8),psVar4 < psVar5);
        bVar8 = psVar5 <= psVar9 && psVar4 < psVar5;
      }
      if (bVar8) goto LAB_00174398;
    }
  }
  else {
    operator==();
LAB_001743a5:
    operator==();
LAB_001743aa:
    operator==();
  }
  operator==();
  pcVar3 = (char *)((value_type *)a)->first;
  if (pcVar3 == (char *)0x0) {
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void*,unsigned_long>,absl::lts_20250127::container_internal::HashEq<void*,void>::Hash,absl::lts_20250127::container_internal::HashEq<void*,void>::Eq,std::allocator<std::pair<void*const,unsigned_long>>>
    ::iterator::operator*((iterator *)a);
  }
  else if (pcVar3 != kEmptyGroup + 0x10) {
    if (-1 < *pcVar3) {
      return SUB81(((value_type *)a)->second,0);
    }
    goto LAB_001743e2;
  }
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void*,unsigned_long>,absl::lts_20250127::container_internal::HashEq<void*,void>::Hash,absl::lts_20250127::container_internal::HashEq<void*,void>::Eq,std::allocator<std::pair<void*const,unsigned_long>>>
  ::iterator::operator*((iterator *)a);
LAB_001743e2:
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void*,unsigned_long>,absl::lts_20250127::container_internal::HashEq<void*,void>::Hash,absl::lts_20250127::container_internal::HashEq<void*,void>::Eq,std::allocator<std::pair<void*const,unsigned_long>>>
  ::iterator::operator*((iterator *)a);
  if (((value_type *)a)->first == (void *)0x1) {
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
    ::AssertNotDebugCapacity
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                *)a);
    if ((((value_type *)a)->second < 2) ||
       (psVar7 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                 ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                             *)a), (ctrl_t *)(psVar7->value).first != b->ctrl_)) {
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
      ::AssertNotDebugCapacity
                ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                  *)a);
      uVar6 = 0;
    }
    else {
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
      ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                  *)a);
      uVar6 = 0xf0;
    }
    return (bool)uVar6;
  }
  if (((value_type *)a)->first != (void *)0x0) {
    __assert_fail("(is_soo()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe21,
                  "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<void *, unsigned long>, absl::container_internal::HashEq<void *>::Hash, absl::container_internal::HashEq<void *>::Eq, std::allocator<std::pair<void *const, unsigned long>>>::find_soo(const key_arg<K> &) [Policy = absl::container_internal::FlatHashMapPolicy<void *, unsigned long>, Hash = absl::container_internal::HashEq<void *>::Hash, Eq = absl::container_internal::HashEq<void *>::Eq, Alloc = std::allocator<std::pair<void *const, unsigned long>>, K = void *]"
                 );
  }
  __assert_fail("cap >= kDefaultCapacity",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xb75,
                "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<void *, unsigned long>, absl::container_internal::HashEq<void *>::Hash, absl::container_internal::HashEq<void *>::Eq, std::allocator<std::pair<void *const, unsigned long>>>::capacity() const [Policy = absl::container_internal::FlatHashMapPolicy<void *, unsigned long>, Hash = absl::container_internal::HashEq<void *>::Hash, Eq = absl::container_internal::HashEq<void *>::Eq, Alloc = std::allocator<std::pair<void *const, unsigned long>>]"
               );
}

Assistant:

bool operator==(const iterator& a, const iterator& b) {
      AssertIsValidForComparison(a.ctrl_, a.generation(), a.generation_ptr());
      AssertIsValidForComparison(b.ctrl_, b.generation(), b.generation_ptr());
      AssertSameContainer(a.ctrl_, b.ctrl_, a.slot_, b.slot_,
                          a.generation_ptr(), b.generation_ptr());
      return a.ctrl_ == b.ctrl_;
    }